

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

void __thiscall
cnn::LookupNode::forward_impl
          (LookupNode *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *__src;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  float *v;
  uint i;
  uint b;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  uint local_1c;
  
  sVar5 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar5 != 0) {
    __assert_fail("xs.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                  ,0x8a,
                  "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if (*(long *)(in_RDI + 0x78) == 0) {
    if (*(long *)(in_RDI + 0x98) == 0) {
      __assert_fail("pindices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                    ,0x90,
                    "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    uVar2 = Dim::batch_elems(in_RDX);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x98));
    if (uVar2 != sVar5) {
      __assert_fail("fx.d.batch_elems() == pindices->size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                    ,0x91,
                    "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    for (local_1c = 0;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x98))
        , local_1c < sVar5; local_1c = local_1c + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      uVar2 = *pvVar7;
      sVar5 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                        ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                         (*(long *)(in_RDI + 0xa0) + 0x30));
      if (sVar5 <= uVar2) {
        __assert_fail("i < params->values.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                      ,0x94,
                      "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                     );
      }
      in_stack_ffffffffffffff90 =
           *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDX[1].d + 1);
      uVar3 = Dim::batch_size(in_RDX);
      uVar4 = Dim::batch_elems(in_RDX);
      p_Var1 = &in_stack_ffffffffffffff90->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
      pvVar6 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                         ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                          (*(long *)(in_RDI + 0xa0) + 0x30),(ulong)uVar2);
      __src = pvVar6->v;
      uVar2 = Dim::batch_size(in_RDX);
      memcpy((void *)((long)&(p_Var1->_M_impl).super__Vector_impl_data._M_start +
                     (ulong)(uVar3 * (local_1c % uVar4)) * 4),__src,(ulong)uVar2 << 2);
    }
  }
  else {
    uVar2 = **(uint **)(in_RDI + 0x78);
    sVar5 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                      ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                       (*(long *)(in_RDI + 0xa0) + 0x30));
    if (sVar5 <= uVar2) {
      __assert_fail("*pindex < params->values.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                    ,0x8c,
                    "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    uVar2 = Dim::batch_elems(in_RDX);
    if (uVar2 != 1) {
      __assert_fail("fx.d.batch_elems() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/param-nodes.cc"
                    ,0x8d,
                    "virtual void cnn::LookupNode::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    pvVar6 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                        (*(long *)(in_RDI + 0xa0) + 0x30),(ulong)**(uint **)(in_RDI + 0x78));
    *(float **)(in_RDX[1].d + 1) = pvVar6->v;
  }
  return;
}

Assistant:

void LookupNode::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 0);
  if(pindex) {
    assert(*pindex < params->values.size());
    assert (fx.d.batch_elems() == 1);
    fx.v = params->values[*pindex].v;
  } else {
    assert (pindices);
    assert (fx.d.batch_elems() == pindices->size());
    for (unsigned b = 0; b < pindices->size(); ++b) {
      unsigned i = pindices->at(b);
      assert (i < params->values.size());
      float* v = fx.v + fx.d.batch_size() * (b % fx.d.batch_elems());
#if HAVE_CUDA
      cudaMemcpyAsync(v, params->values[i].v, fx.d.batch_size() * sizeof(float), cudaMemcpyDeviceToDevice);
#else
      memcpy(v, params->values[i].v, fx.d.batch_size() * sizeof(float));
#endif
    }
  }
}